

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

void vkt::anon_unknown_0::markUndefined
               (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                *values,BVec4 *mask,UVec2 *targetSize,UVec2 *offset,UVec2 *size)

{
  ushort *puVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  int in_R9D;
  uint uVar5;
  uint uVar6;
  bool *pbVar7;
  ulong uVar8;
  int in_stack_00000008;
  
  uVar6 = in_stack_00000008 + (uint)size;
  if ((uint)size < uVar6) {
    uVar5 = in_R9D + (uint)offset;
    do {
      if ((uint)offset < uVar5) {
        uVar8 = (ulong)offset & 0xffffffff;
        do {
          lVar3 = 0;
          pbVar7 = mask->m_data;
          do {
            if (*pbVar7 == true) {
              bVar2 = (byte)lVar3 & 0x1f;
              puVar1 = (ushort *)
                       ((long)&(values->
                               super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                               )._M_impl.super__Vector_impl_data._M_start +
                       (ulong)(uint)((int)size * (int)targetSize + (int)uVar8) * 2);
              *puVar1 = *puVar1 & ((ushort)(-2 << bVar2) | (ushort)(0xfffffffe >> 0x20 - bVar2));
            }
            lVar3 = lVar3 + 2;
            pbVar7 = pbVar7 + 1;
          } while (lVar3 != 8);
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar5);
      }
      uVar4 = (int)size + 1;
      size = (UVec2 *)(ulong)uVar4;
    } while (uVar4 != uVar6);
  }
  return;
}

Assistant:

void markUndefined (vector<PixelValue>&	values,
					const BVec4&		mask,
					const UVec2&		targetSize,
					const UVec2&		offset,
					const UVec2&		size)
{
	DE_ASSERT(targetSize.x() * targetSize.y() == (deUint32)values.size());

	for (deUint32 y = offset.y(); y < offset.y() + size.y(); y++)
	for (deUint32 x = offset.x(); x < offset.x() + size.x(); x++)
	{
		for (int compNdx = 0; compNdx < 4; compNdx++)
		{
			if (mask[compNdx])
				values[x + y * targetSize.x()].setUndefined(compNdx);
		}
	}
}